

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

int socket_close(Curl_easy *data,connectdata *conn,int use_callback,curl_socket_t sock)

{
  int in_EAX;
  int extraout_EAX;
  int iVar1;
  
  if (sock == -1) {
    return in_EAX;
  }
  if ((conn != (connectdata *)0x0 && use_callback != 0) &&
     (conn->fclosesocket != (curl_closesocket_callback)0x0)) {
    Curl_multi_will_close(data,sock);
    Curl_set_in_callback(data,true);
    (*conn->fclosesocket)(conn->closesocket_client,sock);
    Curl_set_in_callback(data,false);
    return extraout_EAX;
  }
  if (conn != (connectdata *)0x0) {
    Curl_multi_will_close(data,sock);
  }
  iVar1 = close(sock);
  return iVar1;
}

Assistant:

static int socket_close(struct Curl_easy *data, struct connectdata *conn,
                        int use_callback, curl_socket_t sock)
{
  if(CURL_SOCKET_BAD == sock)
    return 0;

  if(use_callback && conn && conn->fclosesocket) {
    int rc;
    Curl_multi_will_close(data, sock);
    Curl_set_in_callback(data, TRUE);
    rc = conn->fclosesocket(conn->closesocket_client, sock);
    Curl_set_in_callback(data, FALSE);
    return rc;
  }

  if(conn)
    /* tell the multi-socket code about this */
    Curl_multi_will_close(data, sock);

  sclose(sock);

  return 0;
}